

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

void __thiscall QFileDevicePrivate::QFileDevicePrivate(QFileDevicePrivate *this)

{
  QIODevicePrivate *in_RDI;
  int in_stack_ffffffffffffffec;
  
  QIODevicePrivate::QIODevicePrivate(in_RDI,in_stack_ffffffffffffffec);
  in_RDI->_vptr_QIODevicePrivate = (_func_int **)&PTR__QFileDevicePrivate_001f3388;
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::
  unique_ptr<std::default_delete<QAbstractFileEngine>,void>
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)in_RDI);
  in_RDI[1].pos = 0;
  QFlags<QFileDevice::FileHandleFlag>::QFlags((QFlags<QFileDevice::FileHandleFlag> *)0x12dd2c);
  *(undefined4 *)((long)&in_RDI[1].devicePos + 4) = 0;
  *(undefined1 *)&in_RDI[1].transactionPos = 0;
  in_RDI->writeBufferChunkSize = 0x4000;
  return;
}

Assistant:

QFileDevicePrivate::QFileDevicePrivate()
    : cachedSize(0),
      error(QFile::NoError), lastWasWrite(false)
{
    writeBufferChunkSize = QFILE_WRITEBUFFER_SIZE;
}